

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Dmc::write_register(Nes_Dmc *this,int addr,int data)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  Nes_Dmc *in_RDI;
  int faked_nonlinear;
  int old_dac;
  
  if (in_ESI == 0) {
    in_RDI->period = (int)dmc_period_table[in_RDI->pal_mode & 1][(int)(in_EDX & 0xf)];
    in_RDI->irq_enabled = (in_EDX & 0xc0) == 0x80;
    in_RDI->irq_flag = (in_RDI->irq_flag & 1U & in_RDI->irq_enabled & 1U) != 0;
    recalc_irq(in_RDI);
  }
  else if (in_ESI == 1) {
    iVar1 = in_RDI->dac;
    in_RDI->dac = in_EDX & 0x7f;
    if ((in_RDI->nonlinear & 1U) == 0) {
      (in_RDI->super_Nes_Osc).last_amp = in_RDI->dac - ((uint)""[in_RDI->dac] - (uint)""[iVar1]);
    }
  }
  return;
}

Assistant:

void Nes_Dmc::write_register( int addr, int data )
{
	if ( addr == 0 )
	{
		period = dmc_period_table [pal_mode] [data & 15];
		irq_enabled = (data & 0xC0) == 0x80; // enabled only if loop disabled
		irq_flag &= irq_enabled;
		recalc_irq();
	}
	else if ( addr == 1 )
	{
		int old_dac = dac;
		dac = data & 0x7F;
		
		// adjust last_amp so that "pop" amplitude will be properly non-linear
		// with respect to change in dac
		int faked_nonlinear = dac - (dac_table [dac] - dac_table [old_dac]);
		if ( !nonlinear )
			last_amp = faked_nonlinear;
	}
}